

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

position_type __thiscall
io::posix::file::seek(file *this,offset_type offset,seek_mode from,error_code *ec)

{
  native_handle_type __fd;
  int iVar1;
  int *piVar2;
  __off_t from_start;
  error_category *__cat;
  __off_t o;
  error_code *ec_local;
  seek_mode from_local;
  offset_type offset_local;
  file *this_local;
  
  std::error_code::clear(ec);
  piVar2 = __errno_location();
  *piVar2 = 0;
  __fd = native_handle(this);
  iVar1 = detail::seek_mode_to_whence_arg(from);
  from_start = lseek(__fd,offset,iVar1);
  if (from_start < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    __cat = (error_category *)std::_V2::system_category();
    std::error_code::assign(ec,iVar1,__cat);
    memset(&this_local,0,8);
    stream_position<long>::stream_position((stream_position<long> *)&this_local);
  }
  else {
    stream_position<long>::stream_position((stream_position<long> *)&this_local,from_start);
  }
  return (position_type)(offset_type)this_local;
}

Assistant:

position_type
    seek(offset_type offset, seek_mode from, std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;
        auto o = ::lseek(native_handle(), static_cast<off_t>(offset),
                         detail::seek_mode_to_whence_arg(from));

        if (o < 0) {
            ec.assign(errno, std::system_category());
            return position_type{};
        }

        return position_type{o};
    }